

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O0

bool __thiscall verona::Sequent::lhs_reduce(Sequent *this,Btype *t)

{
  bool bVar1;
  undefined1 local_f8 [8];
  Sequent seq;
  Btype *t_local;
  Sequent *this_local;
  
  seq.bounds._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)t;
  Sequent((Sequent *)local_f8,this);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             *)local_f8,(value_type *)t);
  bVar1 = reduce((Sequent *)local_f8);
  if (bVar1) {
    merge(&this->bounds,
          (Bounds *)
          &seq.assumptions.super__Vector_base<verona::Assume,_std::allocator<verona::Assume>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ~Sequent((Sequent *)local_f8);
  return bVar1;
}

Assistant:

bool lhs_reduce(Btype t)
    {
      Sequent seq(*this);
      seq.lhs_pending.push_back(t);

      if (!seq.reduce())
        return false;

      merge(bounds, seq.bounds);
      return true;
    }